

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexHullComputer.cpp
# Opt level: O1

btScalar __thiscall
btConvexHullComputer::compute
          (btConvexHullComputer *this,void *coords,bool doubleCoords,int stride,int count,
          btScalar shrink,btScalar shrinkClamp)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  Vertex *v;
  btVector3 *ptr;
  Edge *pEVar3;
  Edge *pEVar4;
  int *piVar5;
  undefined8 uVar6;
  Edge **ppEVar7;
  int iVar8;
  long lVar9;
  btVector3 *pbVar10;
  Edge *pEVar11;
  int *piVar12;
  Edge *pEVar13;
  int iVar14;
  int iVar15;
  ulong uVar16;
  Edge *e;
  Edge *pEVar17;
  int iVar18;
  long lVar19;
  int iVar20;
  ulong uVar21;
  btVector3 bVar22;
  int firstCopy;
  btAlignedObjectArray<btConvexHullInternal::Vertex_*> oldVertices;
  btConvexHullInternal hull;
  btScalar local_13c;
  btScalar local_138;
  btScalar bStack_134;
  int local_128;
  btAlignedObjectArray<btConvexHullInternal::Vertex_*> local_110;
  btConvexHullInternal local_f0;
  
  if (count < 1) {
    pbVar10 = (this->vertices).m_data;
    if (pbVar10 != (btVector3 *)0x0) {
      if ((this->vertices).m_ownsMemory == true) {
        btAlignedFreeInternal(pbVar10);
      }
      (this->vertices).m_data = (btVector3 *)0x0;
    }
    (this->vertices).m_ownsMemory = true;
    (this->vertices).m_data = (btVector3 *)0x0;
    (this->vertices).m_size = 0;
    (this->vertices).m_capacity = 0;
    pEVar11 = (this->edges).m_data;
    if (pEVar11 != (Edge *)0x0) {
      if ((this->edges).m_ownsMemory == true) {
        btAlignedFreeInternal(pEVar11);
      }
      (this->edges).m_data = (Edge *)0x0;
    }
    (this->edges).m_ownsMemory = true;
    (this->edges).m_data = (Edge *)0x0;
    (this->edges).m_size = 0;
    (this->edges).m_capacity = 0;
    piVar12 = (this->faces).m_data;
    if (piVar12 != (int *)0x0) {
      if ((this->faces).m_ownsMemory == true) {
        btAlignedFreeInternal(piVar12);
      }
      (this->faces).m_data = (int *)0x0;
    }
    (this->faces).m_ownsMemory = true;
    (this->faces).m_data = (int *)0x0;
    (this->faces).m_size = 0;
    (this->faces).m_capacity = 0;
    local_13c = 0.0;
  }
  else {
    local_f0.vertexPool.arrays = (PoolArray<btConvexHullInternal::Vertex> *)0x0;
    local_f0.vertexPool.nextArray = (PoolArray<btConvexHullInternal::Vertex> *)0x0;
    local_f0.vertexPool.freeObjects = (Vertex *)0x0;
    local_f0.vertexPool.arraySize = 0x100;
    local_f0.edgePool.arrays = (PoolArray<btConvexHullInternal::Edge> *)0x0;
    local_f0.edgePool.nextArray = (PoolArray<btConvexHullInternal::Edge> *)0x0;
    local_f0.edgePool.freeObjects = (Edge *)0x0;
    local_f0.edgePool.arraySize = 0x100;
    local_f0.facePool.arrays = (PoolArray<btConvexHullInternal::Face> *)0x0;
    local_f0.facePool.nextArray = (PoolArray<btConvexHullInternal::Face> *)0x0;
    local_f0.facePool.freeObjects = (Face *)0x0;
    local_f0.facePool.arraySize = 0x100;
    local_f0.originalVertices.m_ownsMemory = true;
    local_f0.originalVertices.m_data = (Vertex **)0x0;
    local_f0.originalVertices.m_size = 0;
    local_f0.originalVertices.m_capacity = 0;
    btConvexHullInternal::compute(&local_f0,coords,doubleCoords,stride,count);
    local_13c = 0.0;
    if ((shrink <= 0.0) ||
       (local_13c = btConvexHullInternal::shrink(&local_f0,shrink,shrinkClamp), 0.0 <= local_13c)) {
      if (((this->vertices).m_size < 0) && ((this->vertices).m_capacity < 0)) {
        pbVar10 = (this->vertices).m_data;
        if (pbVar10 != (btVector3 *)0x0) {
          if ((this->vertices).m_ownsMemory == true) {
            btAlignedFreeInternal(pbVar10);
          }
          (this->vertices).m_data = (btVector3 *)0x0;
        }
        (this->vertices).m_ownsMemory = true;
        (this->vertices).m_data = (btVector3 *)0x0;
        (this->vertices).m_capacity = 0;
      }
      (this->vertices).m_size = 0;
      iVar18 = (this->edges).m_size;
      lVar19 = (long)iVar18;
      if ((lVar19 < 1) && (iVar18 < 0)) {
        if ((this->edges).m_capacity < 0) {
          pEVar11 = (this->edges).m_data;
          if (pEVar11 != (Edge *)0x0) {
            if ((this->edges).m_ownsMemory == true) {
              btAlignedFreeInternal(pEVar11);
            }
            (this->edges).m_data = (Edge *)0x0;
          }
          (this->edges).m_ownsMemory = true;
          (this->edges).m_data = (Edge *)0x0;
          (this->edges).m_capacity = 0;
        }
        if (iVar18 < 0) {
          lVar9 = lVar19 * 0xc;
          do {
            pEVar11 = (this->edges).m_data;
            *(undefined4 *)((long)&pEVar11->targetVertex + lVar9) = 0;
            *(undefined8 *)((long)&pEVar11->next + lVar9) = 0;
            lVar9 = lVar9 + 0xc;
            lVar19 = lVar19 + 1;
          } while (lVar19 != 0);
        }
      }
      (this->edges).m_size = 0;
      iVar18 = (this->faces).m_size;
      lVar19 = (long)iVar18;
      if ((lVar19 < 1) && (iVar18 < 0)) {
        if ((this->faces).m_capacity < 0) {
          piVar12 = (this->faces).m_data;
          if (piVar12 != (int *)0x0) {
            if ((this->faces).m_ownsMemory == true) {
              btAlignedFreeInternal(piVar12);
            }
            (this->faces).m_data = (int *)0x0;
          }
          (this->faces).m_ownsMemory = true;
          (this->faces).m_data = (int *)0x0;
          (this->faces).m_capacity = 0;
        }
        if (iVar18 < 0) {
          memset((this->faces).m_data + lVar19,0,lVar19 * -4);
        }
      }
      (this->faces).m_size = 0;
      local_110.m_ownsMemory = true;
      uVar21 = 0;
      local_110.m_data = (Vertex **)0x0;
      local_110.m_size = 0;
      local_110.m_capacity = 0;
      getVertexCopy(local_f0.vertexList,&local_110);
      if (0 < local_110.m_size) {
        uVar21 = 0;
        do {
          v = local_110.m_data[uVar21];
          bVar22 = btConvexHullInternal::getCoordinates(&local_f0,v);
          iVar18 = (this->vertices).m_size;
          iVar8 = (this->vertices).m_capacity;
          if (iVar18 == iVar8) {
            iVar15 = iVar18 * 2;
            if (iVar18 == 0) {
              iVar15 = 1;
            }
            if (iVar8 < iVar15) {
              if (iVar15 == 0) {
                pbVar10 = (btVector3 *)0x0;
              }
              else {
                pbVar10 = (btVector3 *)btAlignedAllocInternal((long)iVar15 << 4,0x10);
              }
              lVar19 = (long)(this->vertices).m_size;
              if (0 < lVar19) {
                lVar9 = 0;
                do {
                  puVar1 = (undefined8 *)((long)((this->vertices).m_data)->m_floats + lVar9);
                  uVar6 = puVar1[1];
                  puVar2 = (undefined8 *)((long)pbVar10->m_floats + lVar9);
                  *puVar2 = *puVar1;
                  puVar2[1] = uVar6;
                  lVar9 = lVar9 + 0x10;
                } while (lVar19 * 0x10 != lVar9);
              }
              ptr = (this->vertices).m_data;
              if (ptr != (btVector3 *)0x0) {
                if ((this->vertices).m_ownsMemory == true) {
                  btAlignedFreeInternal(ptr);
                }
                (this->vertices).m_data = (btVector3 *)0x0;
              }
              (this->vertices).m_ownsMemory = true;
              (this->vertices).m_data = pbVar10;
              (this->vertices).m_capacity = iVar15;
            }
          }
          local_138 = bVar22.m_floats[0];
          bStack_134 = bVar22.m_floats[1];
          pbVar10 = (this->vertices).m_data + (this->vertices).m_size;
          pbVar10->m_floats[0] = local_138;
          pbVar10->m_floats[1] = bStack_134;
          pbVar10->m_floats[2] = bVar22.m_floats[2];
          pbVar10->m_floats[3] = bVar22.m_floats[3];
          piVar12 = &(this->vertices).m_size;
          *piVar12 = *piVar12 + 1;
          pEVar3 = v->edges;
          if (pEVar3 != (Edge *)0x0) {
            local_128 = -1;
            iVar18 = -1;
            pEVar17 = pEVar3;
            do {
              if (pEVar17->copy < 0) {
                iVar8 = (this->edges).m_size;
                iVar15 = (this->edges).m_capacity;
                if (iVar8 == iVar15) {
                  iVar14 = iVar8 * 2;
                  if (iVar8 == 0) {
                    iVar14 = 1;
                  }
                  if (iVar15 < iVar14) {
                    if (iVar14 == 0) {
                      pEVar11 = (Edge *)0x0;
                    }
                    else {
                      pEVar11 = (Edge *)btAlignedAllocInternal((long)iVar14 * 0xc,0x10);
                    }
                    lVar19 = (long)(this->edges).m_size;
                    if (0 < lVar19) {
                      lVar9 = 0;
                      do {
                        pEVar4 = (this->edges).m_data;
                        *(undefined4 *)((long)&pEVar11->targetVertex + lVar9) =
                             *(undefined4 *)((long)&pEVar4->targetVertex + lVar9);
                        *(undefined8 *)((long)&pEVar11->next + lVar9) =
                             *(undefined8 *)((long)&pEVar4->next + lVar9);
                        lVar9 = lVar9 + 0xc;
                      } while (lVar19 * 0xc != lVar9);
                    }
                    pEVar4 = (this->edges).m_data;
                    if (pEVar4 != (Edge *)0x0) {
                      if ((this->edges).m_ownsMemory == true) {
                        btAlignedFreeInternal(pEVar4);
                      }
                      (this->edges).m_data = (Edge *)0x0;
                    }
                    (this->edges).m_ownsMemory = true;
                    (this->edges).m_data = pEVar11;
                    (this->edges).m_capacity = iVar14;
                  }
                }
                pEVar11 = (this->edges).m_data;
                iVar15 = (this->edges).m_size;
                pEVar11[iVar15].targetVertex = 0;
                pEVar11 = pEVar11 + iVar15;
                pEVar11->next = 0;
                pEVar11->reverse = 0;
                iVar15 = (this->edges).m_capacity;
                iVar14 = (this->edges).m_size + 1;
                (this->edges).m_size = iVar14;
                if (iVar14 == iVar15) {
                  iVar20 = iVar14 * 2;
                  if (iVar14 == 0) {
                    iVar20 = 1;
                  }
                  if (iVar15 < iVar20) {
                    if (iVar20 == 0) {
                      pEVar11 = (Edge *)0x0;
                    }
                    else {
                      pEVar11 = (Edge *)btAlignedAllocInternal((long)iVar20 * 0xc,0x10);
                    }
                    lVar19 = (long)(this->edges).m_size;
                    if (0 < lVar19) {
                      lVar9 = 0;
                      do {
                        pEVar4 = (this->edges).m_data;
                        *(undefined4 *)((long)&pEVar11->targetVertex + lVar9) =
                             *(undefined4 *)((long)&pEVar4->targetVertex + lVar9);
                        *(undefined8 *)((long)&pEVar11->next + lVar9) =
                             *(undefined8 *)((long)&pEVar4->next + lVar9);
                        lVar9 = lVar9 + 0xc;
                      } while (lVar19 * 0xc != lVar9);
                    }
                    pEVar4 = (this->edges).m_data;
                    if (pEVar4 != (Edge *)0x0) {
                      if ((this->edges).m_ownsMemory == true) {
                        btAlignedFreeInternal(pEVar4);
                      }
                      (this->edges).m_data = (Edge *)0x0;
                    }
                    (this->edges).m_ownsMemory = true;
                    (this->edges).m_data = pEVar11;
                    (this->edges).m_capacity = iVar20;
                  }
                }
                pEVar11 = (this->edges).m_data;
                iVar15 = (this->edges).m_size;
                pEVar11[iVar15].targetVertex = 0;
                pEVar11 = pEVar11 + iVar15;
                pEVar11->next = 0;
                pEVar11->reverse = 0;
                piVar12 = &(this->edges).m_size;
                *piVar12 = *piVar12 + 1;
                lVar19 = (long)iVar8;
                pEVar11 = (this->edges).m_data;
                lVar9 = lVar19 + 1;
                pEVar17->copy = iVar8;
                pEVar17->reverse->copy = (int)lVar9;
                pEVar11[lVar19].reverse = 1;
                pEVar11[lVar9].reverse = -1;
                iVar8 = getVertexCopy(pEVar17->target,&local_110);
                pEVar11[lVar19].targetVertex = iVar8;
                pEVar11[lVar9].targetVertex = (int)uVar21;
              }
              iVar8 = pEVar17->copy;
              if (-1 < iVar18) {
                (this->edges).m_data[iVar8].next = iVar18 - iVar8;
                iVar8 = local_128;
              }
              local_128 = iVar8;
              iVar18 = pEVar17->copy;
              pEVar17 = pEVar17->next;
            } while (pEVar17 != pEVar3);
            (this->edges).m_data[local_128].next = iVar18 - local_128;
          }
          uVar21 = uVar21 + 1;
        } while ((long)uVar21 < (long)local_110.m_size);
      }
      if ((int)uVar21 != 0) {
        uVar16 = 0;
        do {
          pEVar3 = local_110.m_data[uVar16]->edges;
          pEVar17 = pEVar3;
          if (pEVar3 != (Edge *)0x0) {
            do {
              if (-1 < pEVar17->copy) {
                iVar18 = (this->faces).m_size;
                iVar8 = (this->faces).m_capacity;
                if (iVar18 == iVar8) {
                  iVar15 = iVar18 * 2;
                  if (iVar18 == 0) {
                    iVar15 = 1;
                  }
                  if (iVar8 < iVar15) {
                    if (iVar15 == 0) {
                      piVar12 = (int *)0x0;
                    }
                    else {
                      piVar12 = (int *)btAlignedAllocInternal((long)iVar15 << 2,0x10);
                    }
                    lVar19 = (long)(this->faces).m_size;
                    if (0 < lVar19) {
                      piVar5 = (this->faces).m_data;
                      lVar9 = 0;
                      do {
                        piVar12[lVar9] = piVar5[lVar9];
                        lVar9 = lVar9 + 1;
                      } while (lVar19 != lVar9);
                    }
                    piVar5 = (this->faces).m_data;
                    if (piVar5 != (int *)0x0) {
                      if ((this->faces).m_ownsMemory == true) {
                        btAlignedFreeInternal(piVar5);
                      }
                      (this->faces).m_data = (int *)0x0;
                    }
                    (this->faces).m_ownsMemory = true;
                    (this->faces).m_data = piVar12;
                    (this->faces).m_capacity = iVar15;
                  }
                }
                (this->faces).m_data[(this->faces).m_size] = pEVar17->copy;
                piVar12 = &(this->faces).m_size;
                *piVar12 = *piVar12 + 1;
                pEVar13 = pEVar17;
                do {
                  pEVar13->copy = -1;
                  pEVar13 = pEVar13->reverse->prev;
                } while (pEVar13 != pEVar17);
              }
              ppEVar7 = &pEVar17->next;
              pEVar17 = *ppEVar7;
            } while (*ppEVar7 != pEVar3);
          }
          uVar16 = uVar16 + 1;
        } while (uVar16 != (uVar21 & 0xffffffff));
      }
      btAlignedObjectArray<btConvexHullInternal::Vertex_*>::~btAlignedObjectArray(&local_110);
    }
    else {
      pbVar10 = (this->vertices).m_data;
      if (pbVar10 != (btVector3 *)0x0) {
        if ((this->vertices).m_ownsMemory == true) {
          btAlignedFreeInternal(pbVar10);
        }
        (this->vertices).m_data = (btVector3 *)0x0;
      }
      (this->vertices).m_ownsMemory = true;
      (this->vertices).m_data = (btVector3 *)0x0;
      (this->vertices).m_size = 0;
      (this->vertices).m_capacity = 0;
      pEVar11 = (this->edges).m_data;
      if (pEVar11 != (Edge *)0x0) {
        if ((this->edges).m_ownsMemory == true) {
          btAlignedFreeInternal(pEVar11);
        }
        (this->edges).m_data = (Edge *)0x0;
      }
      (this->edges).m_ownsMemory = true;
      (this->edges).m_data = (Edge *)0x0;
      (this->edges).m_size = 0;
      (this->edges).m_capacity = 0;
      piVar12 = (this->faces).m_data;
      if (piVar12 != (int *)0x0) {
        if ((this->faces).m_ownsMemory == true) {
          btAlignedFreeInternal(piVar12);
        }
        (this->faces).m_data = (int *)0x0;
      }
      (this->faces).m_ownsMemory = true;
      (this->faces).m_data = (int *)0x0;
      (this->faces).m_size = 0;
      (this->faces).m_capacity = 0;
    }
    btAlignedObjectArray<btConvexHullInternal::Vertex_*>::~btAlignedObjectArray
              (&local_f0.originalVertices);
    btConvexHullInternal::Pool<btConvexHullInternal::Face>::~Pool(&local_f0.facePool);
    btConvexHullInternal::Pool<btConvexHullInternal::Edge>::~Pool(&local_f0.edgePool);
    btConvexHullInternal::Pool<btConvexHullInternal::Vertex>::~Pool(&local_f0.vertexPool);
  }
  return local_13c;
}

Assistant:

btScalar btConvexHullComputer::compute(const void* coords, bool doubleCoords, int stride, int count, btScalar shrink, btScalar shrinkClamp)
{
	if (count <= 0)
	{
		vertices.clear();
		edges.clear();
		faces.clear();
		return 0;
	}

	btConvexHullInternal hull;
	hull.compute(coords, doubleCoords, stride, count);

	btScalar shift = 0;
	if ((shrink > 0) && ((shift = hull.shrink(shrink, shrinkClamp)) < 0))
	{
		vertices.clear();
		edges.clear();
		faces.clear();
		return shift;
	}

	vertices.resize(0);
	edges.resize(0);
	faces.resize(0);

	btAlignedObjectArray<btConvexHullInternal::Vertex*> oldVertices;
	getVertexCopy(hull.vertexList, oldVertices);
	int copied = 0;
	while (copied < oldVertices.size())
	{
		btConvexHullInternal::Vertex* v = oldVertices[copied];
		vertices.push_back(hull.getCoordinates(v));
		btConvexHullInternal::Edge* firstEdge = v->edges;
		if (firstEdge)
		{
			int firstCopy = -1;
			int prevCopy = -1;
			btConvexHullInternal::Edge* e = firstEdge;
			do
			{
				if (e->copy < 0)
				{
					int s = edges.size();
					edges.push_back(Edge());
					edges.push_back(Edge());
					Edge* c = &edges[s];
					Edge* r = &edges[s + 1];
					e->copy = s;
					e->reverse->copy = s + 1;
					c->reverse = 1;
					r->reverse = -1;
					c->targetVertex = getVertexCopy(e->target, oldVertices);
					r->targetVertex = copied;
#ifdef DEBUG_CONVEX_HULL
					printf("      CREATE: Vertex *%d has edge to *%d\n", copied, c->getTargetVertex());
#endif
				}
				if (prevCopy >= 0)
				{
					edges[e->copy].next = prevCopy - e->copy;
				}
				else
				{
					firstCopy = e->copy;
				}
				prevCopy = e->copy;
				e = e->next;
			} while (e != firstEdge);
			edges[firstCopy].next = prevCopy - firstCopy;
		}
		copied++;
	}

	for (int i = 0; i < copied; i++)
	{
		btConvexHullInternal::Vertex* v = oldVertices[i];
		btConvexHullInternal::Edge* firstEdge = v->edges;
		if (firstEdge)
		{
			btConvexHullInternal::Edge* e = firstEdge;
			do
			{
				if (e->copy >= 0)
				{
#ifdef DEBUG_CONVEX_HULL
					printf("Vertex *%d has edge to *%d\n", i, edges[e->copy].getTargetVertex());
#endif
					faces.push_back(e->copy);
					btConvexHullInternal::Edge* f = e;
					do
					{
#ifdef DEBUG_CONVEX_HULL
						printf("   Face *%d\n", edges[f->copy].getTargetVertex());
#endif
						f->copy = -1;
						f = f->reverse->prev;
					} while (f != e);
				}
				e = e->next;
			} while (e != firstEdge);
		}
	}

	return shift;
}